

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.cpp
# Opt level: O1

TransactionException *
duckdb::ErrorManager::InvalidatedTransaction
          (TransactionException *__return_storage_ptr__,ClientContext *context)

{
  DatabaseInstance *pDVar1;
  type this;
  string local_30;
  
  pDVar1 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
  this = unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>,_true>::
         operator*(&(pDVar1->config).error_manager);
  FormatException<>(&local_30,this,INVALIDATED_TRANSACTION);
  TransactionException::TransactionException(__return_storage_ptr__,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

TransactionException ErrorManager::InvalidatedTransaction(ClientContext &context) {
	return TransactionException(ErrorManager::FormatException(context, ErrorType::INVALIDATED_TRANSACTION));
}